

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::ReleaseSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *this,SegmentBase<Memory::VirtualAllocWrapper> *segment)

{
  size_t *psVar1;
  HANDLE pVVar2;
  size_t sVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  HANDLE pVVar7;
  
  bVar5 = ValidThreadAccess(this);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x617,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar5) goto LAB_00701871;
    *puVar6 = 0;
  }
  if (this->disablePageReuse != true) {
    PageTracking::ReportFree(this,segment->address,segment->segmentPageCount << 0xc);
    sVar3 = segment->segmentPageCount;
    SubUsedBytes(this,sVar3 << 0xc);
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar1 = &this->memoryData->releasePageCount;
      *psVar1 = *psVar1 + sVar3;
    }
    LogFreeSegment(this,segment);
    DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
    RemoveElement<Memory::NoThrowHeapAllocator>
              (&this->largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment)
    ;
    return;
  }
  pVVar2 = this->processHandle;
  pVVar7 = GetCurrentProcess();
  if (pVVar2 != pVVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x61b,"(this->processHandle == GetCurrentProcess())",
                       "this->processHandle == GetCurrentProcess()");
    if (!bVar5) {
LAB_00701871:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  VirtualFree(segment->address,segment->segmentPageCount << 0xc,0x4000);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ReleaseSegment(TSegment * segment)
{
    ASSERT_THREAD();
#ifdef RECYCLER_NO_PAGE_REUSE
    if (disablePageReuse)
    {
        Assert(this->processHandle == GetCurrentProcess());
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        VirtualFree(segment->GetAddress(), segment->GetPageCount() * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        return;
    }
#endif
    PageTracking::ReportFree((PageAllocator*)this, segment->GetAddress(), AutoSystemInfo::PageSize * segment->GetPageCount());
    LogFreePages(segment->GetPageCount());
    LogFreeSegment(segment);
    largeSegments.RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
}